

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

ssize_t base64_encode_using_maps
                  (base64_maps_t *maps,char *dest,size_t destlen,char *src,size_t srclen)

{
  int *piVar1;
  long lVar2;
  ssize_t sVar3;
  
  if (destlen < ((srclen + 2) / 3) * 4) {
    piVar1 = __errno_location();
    *piVar1 = 0x4b;
    sVar3 = -1;
  }
  else {
    sVar3 = 0;
    for (lVar2 = 0; 2 < lVar2 + srclen; lVar2 = lVar2 + -3) {
      base64_encode_triplet_using_maps(maps,dest + sVar3,src);
      sVar3 = sVar3 + 4;
      src = src + 3;
    }
    if ((ulong)-lVar2 < srclen) {
      base64_encode_tail_using_maps(maps,dest + sVar3,src,lVar2 + srclen);
      sVar3 = sVar3 + 4;
    }
    memset(dest + sVar3,0,destlen - sVar3);
  }
  return sVar3;
}

Assistant:

ssize_t base64_encode_using_maps(const base64_maps_t *maps,
				 char *dest, const size_t destlen,
				 const char *src, const size_t srclen)
{
	size_t src_offset = 0;
	size_t dest_offset = 0;

	if (destlen < base64_encoded_length(srclen)) {
		errno = EOVERFLOW;
		return -1;
	}

	while (srclen - src_offset >= 3) {
		base64_encode_triplet_using_maps(maps, &dest[dest_offset], &src[src_offset]);
		src_offset += 3;
		dest_offset += 4;
	}

	if (src_offset < srclen) {
		base64_encode_tail_using_maps(maps, &dest[dest_offset], &src[src_offset], srclen-src_offset);
		dest_offset += 4;
	}

	memset(&dest[dest_offset], '\0', destlen-dest_offset);

	return dest_offset;
}